

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFRAgent.cpp
# Opt level: O0

void __thiscall
Agent::CFRAgent<Kuhn::Game>::CFRAgent(CFRAgent<Kuhn::Game> *this,mt19937 *engine,string *path)

{
  undefined1 local_298 [8];
  binary_iarchive ia;
  istream local_228 [8];
  ifstream ifs;
  string *path_local;
  mt19937 *engine_local;
  CFRAgent<Kuhn::Game> *this_local;
  
  this->mEngine = engine;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>_>
  ::unordered_map(&this->mStrategy);
  std::ifstream::ifstream(local_228,path,8);
  boost::archive::binary_iarchive::binary_iarchive((binary_iarchive *)local_298,local_228,0);
  boost::archive::detail::interface_iarchive<boost::archive::binary_iarchive>::operator>>
            ((interface_iarchive<boost::archive::binary_iarchive> *)local_298,&this->mStrategy);
  std::ifstream::close();
  boost::archive::binary_iarchive::~binary_iarchive((binary_iarchive *)local_298);
  std::ifstream::~ifstream(local_228);
  return;
}

Assistant:

CFRAgent<T>::CFRAgent(std::mt19937 &engine, const std::string &path) : mEngine(engine) {
    std::ifstream ifs(path);
    boost::archive::binary_iarchive ia(ifs);
    ia >> mStrategy;
    ifs.close();
}